

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_differencer_unittest.cc
# Opt level: O0

string * __thiscall
google::protobuf::(anonymous_namespace)::ComparisonTest::Run_abi_cxx11_
          (string *__return_storage_ptr__,void *this,Message *msg1,Message *msg2)

{
  bool bVar1;
  char *message;
  char *in_R9;
  string local_238;
  AssertHelper local_218;
  Message local_210;
  bool local_201;
  undefined1 local_200 [8];
  AssertionResult gtest_ar_;
  undefined1 local_1e0 [8];
  MessageDifferencer differencer;
  Message *msg2_local;
  Message *msg1_local;
  ComparisonTest *this_local;
  string *output;
  
  differencer.unpack_any_field_.dynamic_message_factory_._M_t.
  super___uniq_ptr_impl<google::protobuf::DynamicMessageFactory,_std::default_delete<google::protobuf::DynamicMessageFactory>_>
  ._M_t.
  super__Tuple_impl<0UL,_google::protobuf::DynamicMessageFactory_*,_std::default_delete<google::protobuf::DynamicMessageFactory>_>
  .super__Head_base<0UL,_google::protobuf::DynamicMessageFactory_*,_false>._M_head_impl._7_1_ = 0;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  util::MessageDifferencer::MessageDifferencer((MessageDifferencer *)local_1e0);
  util::MessageDifferencer::ReportDifferencesToString
            ((MessageDifferencer *)local_1e0,__return_storage_ptr__);
  if ((*(byte *)((long)this + 0x1090) & 1) != 0) {
    util::MessageDifferencer::set_message_field_comparison
              ((MessageDifferencer *)local_1e0,EQUIVALENT);
  }
  protobuf::anon_unknown_0::ComparisonTest::SetSpecialFieldOption
            ((ComparisonTest *)this,msg1,(MessageDifferencer *)local_1e0);
  bVar1 = util::MessageDifferencer::Compare((MessageDifferencer *)local_1e0,msg1,msg2);
  local_201 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_200,&local_201,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_200);
  if (!bVar1) {
    testing::Message::Message(&local_210);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_238,(internal *)local_200,(AssertionResult *)0x1ebd035,"true","false",in_R9);
    message = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_218,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/message_differencer_unittest.cc"
               ,0xb9f,message);
    testing::internal::AssertHelper::operator=(&local_218,&local_210);
    testing::internal::AssertHelper::~AssertHelper(&local_218);
    std::__cxx11::string::~string((string *)&local_238);
    testing::Message::~Message(&local_210);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_200);
  differencer.unpack_any_field_.dynamic_message_factory_._M_t.
  super___uniq_ptr_impl<google::protobuf::DynamicMessageFactory,_std::default_delete<google::protobuf::DynamicMessageFactory>_>
  ._M_t.
  super__Tuple_impl<0UL,_google::protobuf::DynamicMessageFactory_*,_std::default_delete<google::protobuf::DynamicMessageFactory>_>
  .super__Head_base<0UL,_google::protobuf::DynamicMessageFactory_*,_false>._M_head_impl._7_1_ = 1;
  util::MessageDifferencer::~MessageDifferencer((MessageDifferencer *)local_1e0);
  if ((differencer.unpack_any_field_.dynamic_message_factory_._M_t.
       super___uniq_ptr_impl<google::protobuf::DynamicMessageFactory,_std::default_delete<google::protobuf::DynamicMessageFactory>_>
       ._M_t.
       super__Tuple_impl<0UL,_google::protobuf::DynamicMessageFactory_*,_std::default_delete<google::protobuf::DynamicMessageFactory>_>
       .super__Head_base<0UL,_google::protobuf::DynamicMessageFactory_*,_false>._M_head_impl._7_1_ &
      1) == 0) {
    std::__cxx11::string::~string((string *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Run(const Message& msg1, const Message& msg2) {
    std::string output;

    // Setup the comparison.
    util::MessageDifferencer differencer;
    differencer.ReportDifferencesToString(&output);

    if (use_equivalency_) {
      differencer.set_message_field_comparison(
          util::MessageDifferencer::EQUIVALENT);
    }

    SetSpecialFieldOption(msg1, &differencer);

    // Conduct the comparison.
    EXPECT_FALSE(differencer.Compare(msg1, msg2));

    return output;
  }